

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  byte bVar1;
  stbi__uint32 sVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high != 0) {
      iVar5 = j->code_bits;
      if (iVar5 < 1) {
        stbi__grow_buffer_unsafe(j);
        iVar5 = j->code_bits;
      }
      sVar2 = j->code_buffer;
      j->code_buffer = sVar2 * 2;
      j->code_bits = iVar5 + -1;
      if (-1 < (int)sVar2) {
        return 1;
      }
      *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
      return 1;
    }
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    uVar3 = j->code_buffer;
    uVar9 = (ulong)hdc->fast[uVar3 >> 0x17];
    if (uVar9 == 0xff) {
      lVar8 = 0;
      do {
        lVar7 = lVar8;
        lVar8 = lVar7 + 1;
      } while (hdc->maxcode[lVar7 + 10] <= uVar3 >> 0x10);
      iVar5 = j->code_bits;
      if (lVar8 == 8) {
        j->code_bits = iVar5 + -0x10;
      }
      else if ((int)(lVar7 + 10) <= iVar5) {
        uVar9 = (ulong)(int)((uVar3 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar7 + 10]) +
                            hdc->delta[lVar7 + 10]);
        if ((uVar3 >> (-hdc->size[uVar9] & 0x1f) & stbi__bmask[hdc->size[uVar9]]) !=
            (uint)hdc->code[uVar9]) {
          __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                        ,0x81a,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
        }
        iVar5 = (iVar5 - (int)lVar8) + -9;
        j->code_bits = iVar5;
        j->code_buffer = uVar3 << ((byte)(lVar7 + 10) & 0x1f);
        goto LAB_00129b39;
      }
    }
    else {
      bVar1 = hdc->size[uVar9];
      iVar5 = j->code_bits - (uint)bVar1;
      if ((int)(uint)bVar1 <= j->code_bits) {
        j->code_buffer = uVar3 << (bVar1 & 0x1f);
        j->code_bits = iVar5;
LAB_00129b39:
        bVar1 = hdc->values[uVar9];
        iVar10 = 0;
        if (bVar1 != 0) {
          if (iVar5 < (int)(uint)bVar1) {
            stbi__grow_buffer_unsafe(j);
          }
          iVar10 = 0;
          if (bVar1 < 0x11) {
            uVar3 = j->code_buffer;
            uVar6 = uVar3 << (bVar1 & 0x1f) | uVar3 >> 0x20 - (bVar1 & 0x1f);
            uVar4 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
            j->code_buffer = ~uVar4 & uVar6;
            j->code_bits = j->code_bits - (uint)bVar1;
            iVar10 = 0;
            if (-1 < (int)uVar3) {
              iVar10 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
            }
            iVar10 = iVar10 + (uVar4 & uVar6);
          }
        }
        iVar10 = iVar10 + j->img_comp[b].dc_pred;
        j->img_comp[b].dc_pred = iVar10;
        *data = (short)(iVar10 << ((byte)j->succ_low & 0x1f));
        return 1;
      }
    }
  }
  *(char **)(in_FS_OFFSET + -8) = "can\'t merge dc and ac";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t == -1) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}